

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O0

opj_t2_t * opj_t2_create(opj_image_t *p_image,opj_cp_t *p_cp)

{
  opj_t2_t *l_t2;
  opj_cp_t *p_cp_local;
  opj_image_t *p_image_local;
  
  p_image_local = (opj_image_t *)opj_calloc(1,0x10);
  if (p_image_local == (opj_image_t *)0x0) {
    p_image_local = (opj_image_t *)0x0;
  }
  else {
    *(opj_image_t **)p_image_local = p_image;
    *(opj_cp_t **)&p_image_local->x1 = p_cp;
  }
  return (opj_t2_t *)p_image_local;
}

Assistant:

opj_t2_t* opj_t2_create(opj_image_t *p_image, opj_cp_t *p_cp)
{
    /* create the t2 structure */
    opj_t2_t *l_t2 = (opj_t2_t*)opj_calloc(1, sizeof(opj_t2_t));
    if (!l_t2) {
        return NULL;
    }

    l_t2->image = p_image;
    l_t2->cp = p_cp;

    return l_t2;
}